

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3LookasideUsed(sqlite3 *db,int *pHighwater)

{
  u32 uVar1;
  u32 uVar2;
  u32 uVar3;
  u32 uVar4;
  int *in_RSI;
  long in_RDI;
  u32 nFree;
  u32 nInit;
  
  uVar1 = countLookasideSlots(*(LookasideSlot **)(in_RDI + 0x1b8));
  uVar2 = countLookasideSlots(*(LookasideSlot **)(in_RDI + 0x1c0));
  uVar3 = countLookasideSlots(*(LookasideSlot **)(in_RDI + 0x1c8));
  uVar4 = countLookasideSlots(*(LookasideSlot **)(in_RDI + 0x1d0));
  if (in_RSI != (int *)0x0) {
    *in_RSI = *(int *)(in_RDI + 0x1a4) - (uVar3 + uVar1);
  }
  return *(int *)(in_RDI + 0x1a4) - (uVar3 + uVar1 + uVar4 + uVar2);
}

Assistant:

SQLITE_PRIVATE int sqlite3LookasideUsed(sqlite3 *db, int *pHighwater){
  u32 nInit = countLookasideSlots(db->lookaside.pInit);
  u32 nFree = countLookasideSlots(db->lookaside.pFree);
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  nInit += countLookasideSlots(db->lookaside.pSmallInit);
  nFree += countLookasideSlots(db->lookaside.pSmallFree);
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( pHighwater ) *pHighwater = db->lookaside.nSlot - nInit;
  return db->lookaside.nSlot - (nInit+nFree);
}